

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  byte bVar15;
  AABBNodeMB4D *node1;
  long lVar16;
  size_t sVar17;
  NodeRef *pNVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  uint uVar20;
  Primitive_conflict4 *prim;
  bool bVar21;
  byte bVar22;
  ulong uVar23;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar37;
  undefined1 auVar38 [64];
  vint4 ai_2;
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai_3;
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  vint4 bi_2;
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorKMB<4> local_3582;
  Precalculations pre;
  ulong local_3578;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar24 [16];
  
  sVar17 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar17 != 8) {
    auVar7 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    uVar8 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    uVar23 = vpcmpeqd_avx512vl(auVar7,(undefined1  [16])valid_i->field_0);
    uVar23 = ((byte)uVar8 & 0xf) & uVar23;
    bVar22 = (byte)uVar23;
    if (bVar22 != 0) {
      auVar7 = *(undefined1 (*) [16])(ray + 0x40);
      auVar3 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar47 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar24 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      aVar25._0_4_ = (uint)(bVar22 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
      bVar21 = (bool)((byte)(uVar23 >> 1) & 1);
      aVar25._4_4_ = (uint)bVar21 * auVar24._4_4_ | (uint)!bVar21 * 0x7f800000;
      bVar21 = (bool)((byte)(uVar23 >> 2) & 1);
      aVar25._8_4_ = (uint)bVar21 * auVar24._8_4_ | (uint)!bVar21 * 0x7f800000;
      bVar21 = SUB81(uVar23 >> 3,0);
      aVar25._12_4_ = (uint)bVar21 * auVar24._12_4_ | (uint)!bVar21 * 0x7f800000;
      auVar24 = *(undefined1 (*) [16])(ray + 0x10);
      auVar28._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = auVar24._8_4_ ^ 0x80000000;
      auVar28._12_4_ = auVar24._12_4_ ^ 0x80000000;
      auVar24 = *(undefined1 (*) [16])(ray + 0x20);
      auVar29._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = auVar24._8_4_ ^ 0x80000000;
      auVar29._12_4_ = auVar24._12_4_ ^ 0x80000000;
      bVar15 = (byte)((ushort)((short)uVar23 << 0xc) >> 0xc) ^ 0xf;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar17;
      stack_near[1].field_0 = aVar25;
      if (sVar17 != 0xfffffffffffffff8) {
        auVar26._8_4_ = 0x7fffffff;
        auVar26._0_8_ = 0x7fffffff7fffffff;
        auVar26._12_4_ = 0x7fffffff;
        auVar24 = vandps_avx(auVar7,auVar26);
        auVar43._8_4_ = 0x219392ef;
        auVar43._0_8_ = 0x219392ef219392ef;
        auVar43._12_4_ = 0x219392ef;
        uVar9 = vcmpps_avx512vl(auVar24,auVar43,1);
        bVar21 = (bool)((byte)uVar9 & 1);
        auVar24._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar7._0_4_;
        bVar21 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar7._4_4_;
        bVar21 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar7._8_4_;
        bVar21 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar7._12_4_;
        auVar7 = vandps_avx(auVar3,auVar26);
        uVar9 = vcmpps_avx512vl(auVar7,auVar43,1);
        bVar21 = (bool)((byte)uVar9 & 1);
        auVar27._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar3._0_4_;
        bVar21 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar3._4_4_;
        bVar21 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar3._8_4_;
        bVar21 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar3._12_4_;
        auVar7 = vandps_avx(auVar40,auVar26);
        uVar9 = vcmpps_avx512vl(auVar7,auVar43,1);
        bVar21 = (bool)((byte)uVar9 & 1);
        auVar30._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar40._0_4_;
        bVar21 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar40._4_4_;
        bVar21 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar40._8_4_;
        bVar21 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar40._12_4_;
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar26 = vrcp14ps_avx512vl(auVar24);
        auVar3 = vfnmadd213ps_fma(auVar24,auVar26,auVar40);
        auVar24 = vrcp14ps_avx512vl(auVar27);
        auVar7 = vfnmadd213ps_fma(auVar27,auVar24,auVar40);
        auVar27 = vrcp14ps_avx512vl(auVar30);
        auVar40 = vfnmadd213ps_fma(auVar30,auVar27,auVar40);
        auVar7 = vfmadd132ps_fma(auVar7,auVar24,auVar24);
        auVar3 = vfmadd132ps_fma(auVar3,auVar26,auVar26);
        auVar40 = vfmadd132ps_fma(auVar40,auVar27,auVar27);
        pNVar18 = stack_node + 1;
        auVar48._0_4_ = auVar3._0_4_ * -*(float *)ray;
        auVar48._4_4_ = auVar3._4_4_ * -*(float *)(ray + 4);
        auVar48._8_4_ = auVar3._8_4_ * -*(float *)(ray + 8);
        auVar48._12_4_ = auVar3._12_4_ * -*(float *)(ray + 0xc);
        auVar24 = vmulps_avx512vl(auVar7,auVar28);
        auVar28 = vmulps_avx512vl(auVar40,auVar29);
        auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        bVar21 = (bool)((byte)(uVar23 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
        bVar6 = SUB81(uVar23 >> 3,0);
        auVar49 = ZEXT1664(CONCAT412((uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar29._12_4_,
                                     CONCAT48((uint)bVar5 * auVar27._8_4_ |
                                              (uint)!bVar5 * auVar29._8_4_,
                                              CONCAT44((uint)bVar21 * auVar27._4_4_ |
                                                       (uint)!bVar21 * auVar29._4_4_,
                                                       (uint)(bVar22 & 1) * auVar27._0_4_ |
                                                       (uint)!(bool)(bVar22 & 1) * auVar29._0_4_))))
        ;
        paVar19 = &stack_near[2].field_0;
LAB_007776e5:
        do {
          paVar1 = paVar19 + -1;
          auVar38 = ZEXT1664((undefined1  [16])*paVar1);
          paVar19 = paVar19 + -1;
          auVar29 = auVar49._0_16_;
          uVar8 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar29,1);
          if ((char)uVar8 == '\0') goto LAB_00777995;
          do {
            uVar8 = vcmpps_avx512vl(auVar29,auVar38._0_16_,6);
            uVar20 = (uint)sVar17;
            if ((sVar17 & 8) != 0) {
              if (sVar17 == 0xfffffffffffffff8) goto LAB_007779b6;
              if ((byte)uVar8 == 0) goto LAB_00777995;
              uVar23 = (ulong)(uVar20 & 0xf);
              valid0.v = bVar15 ^ 0xf;
              bVar14 = bVar15;
              if (uVar23 == 8) goto LAB_00777980;
              prim = (Primitive_conflict4 *)(sVar17 & 0xfffffffffffffff0);
              local_3578 = 1;
              goto LAB_007778eb;
            }
            uVar23 = sVar17 & 0xfffffffffffffff0;
            lVar16 = -0x20;
            sVar17 = 8;
            aVar37 = auVar47._0_16_;
            do {
              sVar4 = *(size_t *)(uVar23 + 0x40 + lVar16 * 2);
              if (sVar4 == 8) {
                auVar38 = ZEXT1664((undefined1  [16])aVar37);
                break;
              }
              uVar2 = *(undefined4 *)(uVar23 + 0x120 + lVar16);
              auVar39._4_4_ = uVar2;
              auVar39._0_4_ = uVar2;
              auVar39._8_4_ = uVar2;
              auVar39._12_4_ = uVar2;
              auVar27 = *(undefined1 (*) [16])(ray + 0x70);
              uVar2 = *(undefined4 *)(uVar23 + 0x60 + lVar16);
              auVar31._4_4_ = uVar2;
              auVar31._0_4_ = uVar2;
              auVar31._8_4_ = uVar2;
              auVar31._12_4_ = uVar2;
              auVar30 = vfmadd213ps_avx512vl(auVar39,auVar27,auVar31);
              uVar2 = *(undefined4 *)(uVar23 + 0x160 + lVar16);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0xa0 + lVar16);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar26 = vfmadd213ps_avx512vl(auVar41,auVar27,auVar32);
              uVar2 = *(undefined4 *)(uVar23 + 0x1a0 + lVar16);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0xe0 + lVar16);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar31 = vfmadd213ps_avx512vl(auVar42,auVar27,auVar33);
              uVar2 = *(undefined4 *)(uVar23 + 0x140 + lVar16);
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x80 + lVar16);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar32 = vfmadd213ps_avx512vl(auVar44,auVar27,auVar34);
              uVar2 = *(undefined4 *)(uVar23 + 0x180 + lVar16);
              auVar45._4_4_ = uVar2;
              auVar45._0_4_ = uVar2;
              auVar45._8_4_ = uVar2;
              auVar45._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0xc0 + lVar16);
              auVar35._4_4_ = uVar2;
              auVar35._0_4_ = uVar2;
              auVar35._8_4_ = uVar2;
              auVar35._12_4_ = uVar2;
              auVar33 = vfmadd213ps_avx512vl(auVar45,auVar27,auVar35);
              uVar2 = *(undefined4 *)(uVar23 + 0x1c0 + lVar16);
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x100 + lVar16);
              auVar36._4_4_ = uVar2;
              auVar36._0_4_ = uVar2;
              auVar36._8_4_ = uVar2;
              auVar36._12_4_ = uVar2;
              auVar34 = vfmadd213ps_avx512vl(auVar46,auVar27,auVar36);
              auVar43 = vfmadd213ps_fma(auVar30,auVar3,auVar48);
              auVar35 = vfmadd213ps_avx512vl(auVar26,auVar7,auVar24);
              auVar36 = vfmadd213ps_avx512vl(auVar31,auVar40,auVar28);
              auVar31 = vfmadd213ps_fma(auVar32,auVar3,auVar48);
              auVar32 = vfmadd213ps_avx512vl(auVar33,auVar7,auVar24);
              auVar33 = vfmadd213ps_avx512vl(auVar34,auVar40,auVar28);
              auVar30 = vpminsd_avx(auVar43,auVar31);
              auVar26 = vpminsd_avx(auVar35,auVar32);
              auVar30 = vpmaxsd_avx(auVar30,auVar26);
              auVar26 = vpminsd_avx(auVar36,auVar33);
              auVar30 = vpmaxsd_avx(auVar30,auVar26);
              auVar26 = vpmaxsd_avx(auVar43,auVar31);
              auVar43 = vpmaxsd_avx(auVar35,auVar32);
              auVar31 = vpminsd_avx(auVar26,auVar43);
              auVar26 = vpmaxsd_avx(auVar36,auVar33);
              auVar43 = vpmaxsd_avx(auVar30,(undefined1  [16])aVar25);
              auVar26 = vpminsd_avx512vl(auVar26,auVar29);
              auVar26 = vpminsd_avx(auVar31,auVar26);
              uVar10 = vcmpps_avx512vl(auVar43,auVar26,2);
              bVar14 = (byte)uVar10;
              if ((uVar20 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar23 + 0x200 + lVar16);
                auVar12._4_4_ = uVar2;
                auVar12._0_4_ = uVar2;
                auVar12._8_4_ = uVar2;
                auVar12._12_4_ = uVar2;
                uVar10 = vcmpps_avx512vl(auVar27,auVar12,1);
                uVar2 = *(undefined4 *)(uVar23 + 0x1e0 + lVar16);
                auVar13._4_4_ = uVar2;
                auVar13._0_4_ = uVar2;
                auVar13._8_4_ = uVar2;
                auVar13._12_4_ = uVar2;
                uVar11 = vcmpps_avx512vl(auVar27,auVar13,0xd);
                bVar14 = (byte)uVar10 & (byte)uVar11 & bVar14;
              }
              bVar14 = bVar14 & (byte)uVar8;
              if (bVar14 == 0) {
                auVar38 = ZEXT1664((undefined1  [16])aVar37);
                sVar4 = sVar17;
              }
              else {
                auVar30 = vblendmps_avx512vl((undefined1  [16])auVar47._0_16_,auVar30);
                bVar21 = (bool)(bVar14 >> 1 & 1);
                bVar5 = (bool)(bVar14 >> 2 & 1);
                bVar6 = (bool)(bVar14 >> 3 & 1);
                auVar38 = ZEXT1664(CONCAT412((uint)bVar6 * auVar30._12_4_ |
                                             (uint)!bVar6 * auVar27._12_4_,
                                             CONCAT48((uint)bVar5 * auVar30._8_4_ |
                                                      (uint)!bVar5 * auVar27._8_4_,
                                                      CONCAT44((uint)bVar21 * auVar30._4_4_ |
                                                               (uint)!bVar21 * auVar27._4_4_,
                                                               (uint)(bVar14 & 1) * auVar30._0_4_ |
                                                               (uint)!(bool)(bVar14 & 1) *
                                                               auVar27._0_4_))));
                if (sVar17 != 8) {
                  pNVar18->ptr = sVar17;
                  pNVar18 = pNVar18 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v = aVar37;
                  paVar19 = paVar19 + 1;
                }
              }
              sVar17 = sVar4;
              aVar37 = auVar38._0_16_;
              lVar16 = lVar16 + 4;
            } while (lVar16 != 0);
          } while (sVar17 != 8);
          sVar17 = pNVar18[-1].ptr;
          pNVar18 = pNVar18 + -1;
        } while (sVar17 != 0xfffffffffffffff8);
      }
LAB_007779b6:
      bVar15 = bVar15 & bVar22;
      bVar21 = (bool)(bVar15 >> 1 & 1);
      bVar5 = (bool)(bVar15 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar15 & 1) * -0x800000 | (uint)!(bool)(bVar15 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar21 * -0x800000 | (uint)!bVar21 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar15 >> 3) * -0x800000 | (uint)!(bool)(bVar15 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar21 = uVar23 - 8 <= local_3578;
    local_3578 = local_3578 + 1;
    if (bVar21) break;
LAB_007778eb:
    InstanceArrayIntersectorKMB<4>::occluded(&local_3582,&valid0,&pre,ray,context,prim);
    bVar14 = ~(byte)local_3582 & valid0.v;
    valid0.v = bVar14 & 0xf;
    if (valid0.v == 0) break;
  }
  bVar14 = bVar14 & 0xf ^ 0xf;
  auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
LAB_00777980:
  bVar15 = bVar14 | bVar15;
  if (bVar15 == 0xf) {
    bVar15 = 0xf;
    goto LAB_007779b6;
  }
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar21 = (bool)(bVar15 >> 1 & 1);
  bVar5 = (bool)(bVar15 >> 2 & 1);
  auVar49 = ZEXT1664(CONCAT412((uint)(bVar15 >> 3) * auVar29._12_4_ |
                               (uint)!(bool)(bVar15 >> 3) * auVar49._12_4_,
                               CONCAT48((uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * auVar49._8_4_,
                                        CONCAT44((uint)bVar21 * auVar29._4_4_ |
                                                 (uint)!bVar21 * auVar49._4_4_,
                                                 (uint)(bVar15 & 1) * auVar29._0_4_ |
                                                 (uint)!(bool)(bVar15 & 1) * auVar49._0_4_))));
LAB_00777995:
  sVar17 = pNVar18[-1].ptr;
  pNVar18 = pNVar18 + -1;
  if (sVar17 == 0xfffffffffffffff8) goto LAB_007779b6;
  goto LAB_007776e5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }